

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_select(roaring_bitmap_t *bm,uint32_t rank,uint32_t *element)

{
  bool bVar1;
  _Bool local_3d;
  int local_3c;
  uint32_t uStack_38;
  _Bool valid;
  int i;
  uint32_t start_rank;
  uint16_t key;
  uint8_t typecode;
  container_t *container;
  uint32_t *element_local;
  roaring_bitmap_t *prStack_18;
  uint32_t rank_local;
  roaring_bitmap_t *bm_local;
  
  uStack_38 = 0;
  local_3c = 0;
  local_3d = false;
  container = element;
  element_local._4_4_ = rank;
  prStack_18 = bm;
  while( true ) {
    bVar1 = false;
    if (local_3d == false) {
      bVar1 = local_3c < (prStack_18->high_low_container).size;
    }
    if (!bVar1) break;
    _start_rank = (prStack_18->high_low_container).containers[local_3c];
    i._3_1_ = (prStack_18->high_low_container).typecodes[local_3c];
    local_3d = container_select(_start_rank,i._3_1_,&stack0xffffffffffffffc8,element_local._4_4_,
                                (uint32_t *)container);
    local_3c = local_3c + 1;
  }
  if (local_3d != false) {
    *(uint *)container =
         (uint)(prStack_18->high_low_container).keys[local_3c + -1] << 0x10 | *container;
  }
  return local_3d != false;
}

Assistant:

bool roaring_bitmap_select(const roaring_bitmap_t *bm, uint32_t rank,
                           uint32_t *element) {
    container_t *container;
    uint8_t typecode;
    uint16_t key;
    uint32_t start_rank = 0;
    int i = 0;
    bool valid = false;
    while (!valid && i < bm->high_low_container.size) {
        container = bm->high_low_container.containers[i];
        typecode = bm->high_low_container.typecodes[i];
        valid =
            container_select(container, typecode, &start_rank, rank, element);
        i++;
    }

    if (valid) {
        key = bm->high_low_container.keys[i - 1];
        *element |= (((uint32_t)key) << 16);  // w/o cast, key promotes signed
        return true;
    } else
        return false;
}